

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::FieldOptions::MergePartialFromCodedStream
          (FieldOptions *this,CodedInputStream *input)

{
  uint8 uVar1;
  int iVar2;
  void **ppvVar3;
  bool bVar4;
  uint uVar5;
  Limit limit;
  uint8 *puVar6;
  string *value;
  uint8 *puVar7;
  UninterpretedOption *this_00;
  uint32 tag;
  int iVar8;
  UnknownFieldSet *unknown_fields;
  uint local_44;
  RepeatedPtrFieldBase *local_40;
  UnknownFieldSet *local_38;
  
  local_38 = &this->_unknown_fields_;
  local_40 = &(this->uninterpreted_option_).super_RepeatedPtrFieldBase;
  unknown_fields = local_38;
LAB_001eec37:
  puVar6 = input->buffer_;
  if ((puVar6 < input->buffer_end_) && (tag = (uint32)(char)*puVar6, -1 < (char)*puVar6)) {
    input->last_tag_ = tag;
    input->buffer_ = puVar6 + 1;
  }
  else {
    tag = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = tag;
  }
  if (tag == 0) {
    return true;
  }
  uVar5 = tag & 7;
  switch(tag >> 3) {
  case 1:
    if (uVar5 != 0) break;
    puVar6 = input->buffer_;
    if ((puVar6 < input->buffer_end_) && (uVar1 = *puVar6, -1 < (char)uVar1)) {
      input->buffer_ = puVar6 + 1;
      uVar5 = (int)(char)uVar1;
    }
    else {
      bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_44);
      uVar5 = local_44;
      if (!bVar4) {
        return false;
      }
    }
    if (uVar5 < 3) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      this->ctype_ = uVar5;
    }
    else {
      UnknownFieldSet::AddVarint(unknown_fields,1,(long)(int)uVar5);
    }
    puVar6 = input->buffer_;
    puVar7 = input->buffer_end_;
    if ((puVar6 < puVar7) && (*puVar6 == '\x10')) {
      puVar6 = puVar6 + 1;
      input->buffer_ = puVar6;
LAB_001eedb7:
      if ((puVar6 < puVar7) && (uVar1 = *puVar6, -1 < (char)uVar1)) {
        puVar6 = puVar6 + 1;
        input->buffer_ = puVar6;
        uVar5 = (int)(char)uVar1;
      }
      else {
        bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_44);
        if (!bVar4) {
          return false;
        }
        puVar6 = input->buffer_;
        puVar7 = input->buffer_end_;
        uVar5 = local_44;
      }
      this->packed_ = uVar5 != 0;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
      if ((puVar6 < puVar7) && (*puVar6 == '\x18')) {
        puVar6 = puVar6 + 1;
        input->buffer_ = puVar6;
LAB_001eee10:
        if ((puVar6 < puVar7) && (uVar1 = *puVar6, -1 < (char)uVar1)) {
          puVar6 = puVar6 + 1;
          input->buffer_ = puVar6;
          uVar5 = (int)(char)uVar1;
        }
        else {
          bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_44);
          if (!bVar4) {
            return false;
          }
          puVar6 = input->buffer_;
          puVar7 = input->buffer_end_;
          uVar5 = local_44;
        }
        this->deprecated_ = uVar5 != 0;
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
        if ((puVar6 < puVar7) && (*puVar6 == '(')) {
          puVar6 = puVar6 + 1;
          input->buffer_ = puVar6;
LAB_001eee69:
          if ((puVar6 < puVar7) && (uVar1 = *puVar6, -1 < (char)uVar1)) {
            puVar6 = puVar6 + 1;
            input->buffer_ = puVar6;
            uVar5 = (int)(char)uVar1;
          }
          else {
            bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_44);
            if (!bVar4) {
              return false;
            }
            puVar6 = input->buffer_;
            puVar7 = input->buffer_end_;
            uVar5 = local_44;
          }
          this->lazy_ = uVar5 != 0;
          uVar5 = this->_has_bits_[0] | 4;
          this->_has_bits_[0] = uVar5;
          if ((puVar6 < puVar7) && (*puVar6 == 'J')) {
            input->buffer_ = puVar6 + 1;
LAB_001eeec8:
            this->_has_bits_[0] = uVar5 | 0x10;
            value = this->experimental_map_key_;
            if (value == (string *)internal::kEmptyString_abi_cxx11_) {
              value = (string *)operator_new(0x20);
              (value->_M_dataplus)._M_p = (pointer)&value->field_2;
              value->_M_string_length = 0;
              (value->field_2)._M_local_buf[0] = '\0';
              this->experimental_map_key_ = value;
            }
            bVar4 = internal::WireFormatLite::ReadString(input,value);
            if (!bVar4) {
              return false;
            }
            internal::WireFormat::VerifyUTF8StringFallback
                      ((this->experimental_map_key_->_M_dataplus)._M_p,
                       (int)this->experimental_map_key_->_M_string_length,PARSE);
            puVar7 = input->buffer_;
            puVar6 = input->buffer_end_;
            if ((puVar7 < puVar6) && (*puVar7 == 'P')) {
              puVar7 = puVar7 + 1;
              input->buffer_ = puVar7;
LAB_001eef42:
              if ((puVar7 < puVar6) && (uVar1 = *puVar7, -1 < (char)uVar1)) {
                puVar7 = puVar7 + 1;
                input->buffer_ = puVar7;
                uVar5 = (int)(char)uVar1;
              }
              else {
                bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_44);
                if (!bVar4) {
                  return false;
                }
                puVar7 = input->buffer_;
                puVar6 = input->buffer_end_;
                uVar5 = local_44;
              }
              this->weak_ = uVar5 != 0;
              *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x20;
              if (((1 < (int)puVar6 - (int)puVar7) && (*puVar7 == 0xba)) && (puVar7[1] == '>')) {
                do {
                  input->buffer_ = puVar7 + 2;
LAB_001eefa5:
                  iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
                  iVar8 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
                  if (iVar2 < iVar8) {
                    ppvVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
                    (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ =
                         iVar2 + 1;
                    this_00 = (UninterpretedOption *)ppvVar3[iVar2];
                  }
                  else {
                    if (iVar8 == (this->uninterpreted_option_).super_RepeatedPtrFieldBase.
                                 total_size_) {
                      internal::RepeatedPtrFieldBase::Reserve(local_40,iVar8 + 1);
                      iVar8 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.
                              allocated_size_;
                    }
                    (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_ =
                         iVar8 + 1;
                    this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption>::
                              New();
                    ppvVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
                    iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
                    (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ =
                         iVar2 + 1;
                    ppvVar3[iVar2] = this_00;
                  }
                  puVar6 = input->buffer_;
                  if ((puVar6 < input->buffer_end_) && (uVar1 = *puVar6, -1 < (char)uVar1)) {
                    input->buffer_ = puVar6 + 1;
                    local_44 = (int)(char)uVar1;
                  }
                  else {
                    bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_44);
                    if (!bVar4) {
                      return false;
                    }
                  }
                  iVar2 = input->recursion_depth_;
                  input->recursion_depth_ = iVar2 + 1;
                  if (input->recursion_limit_ <= iVar2) {
                    return false;
                  }
                  limit = io::CodedInputStream::PushLimit(input,local_44);
                  bVar4 = UninterpretedOption::MergePartialFromCodedStream(this_00,input);
                  if (!bVar4) {
                    return false;
                  }
                  if (input->legitimate_message_end_ != true) {
                    return false;
                  }
                  io::CodedInputStream::PopLimit(input,limit);
                  if (0 < input->recursion_depth_) {
                    input->recursion_depth_ = input->recursion_depth_ + -1;
                  }
                  puVar7 = input->buffer_;
                } while (((1 < (int)input->buffer_end_ - (int)puVar7) && (*puVar7 == 0xba)) &&
                        (puVar7[1] == '>'));
                unknown_fields = local_38;
                if ((puVar7 == input->buffer_end_) &&
                   ((input->buffer_size_after_limit_ != 0 ||
                    (input->total_bytes_read_ == input->current_limit_)))) {
                  input->last_tag_ = 0;
                  input->legitimate_message_end_ = true;
                  return true;
                }
              }
            }
          }
        }
      }
    }
    goto LAB_001eec37;
  case 2:
    if (uVar5 == 0) {
      puVar6 = input->buffer_;
      puVar7 = input->buffer_end_;
      goto LAB_001eedb7;
    }
    break;
  case 3:
    if (uVar5 == 0) {
      puVar6 = input->buffer_;
      puVar7 = input->buffer_end_;
      goto LAB_001eee10;
    }
    break;
  case 4:
  case 6:
  case 7:
  case 8:
    break;
  case 5:
    if (uVar5 == 0) {
      puVar6 = input->buffer_;
      puVar7 = input->buffer_end_;
      goto LAB_001eee69;
    }
    break;
  case 9:
    if (uVar5 == 2) {
      uVar5 = this->_has_bits_[0];
      goto LAB_001eeec8;
    }
    break;
  case 10:
    if (uVar5 == 0) {
      puVar7 = input->buffer_;
      puVar6 = input->buffer_end_;
      goto LAB_001eef42;
    }
    break;
  default:
    if ((tag >> 3 == 999) && (uVar5 == 2)) goto LAB_001eefa5;
  }
  if (uVar5 == 4) {
    return true;
  }
  if (tag < 8000) {
    bVar4 = internal::WireFormat::SkipField(input,tag,unknown_fields);
  }
  else {
    bVar4 = internal::ExtensionSet::ParseField
                      (&this->_extensions_,tag,input,default_instance_,unknown_fields);
  }
  if (bVar4 == false) {
    return false;
  }
  goto LAB_001eec37;
}

Assistant:

bool FieldOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldOptions_CType_IsValid(value)) {
            set_ctype(static_cast< ::google::protobuf::FieldOptions_CType >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_packed;
        break;
      }

      // optional bool packed = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_packed:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &packed_)));
          set_has_packed();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(24)) goto parse_deprecated;
        break;
      }

      // optional bool deprecated = 3 [default = false];
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_deprecated:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
          set_has_deprecated();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(40)) goto parse_lazy;
        break;
      }

      // optional bool lazy = 5 [default = false];
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_lazy:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &lazy_)));
          set_has_lazy();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(74)) goto parse_experimental_map_key;
        break;
      }

      // optional string experimental_map_key = 9;
      case 9: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_experimental_map_key:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_experimental_map_key()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->experimental_map_key().data(), this->experimental_map_key().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_weak;
        break;
      }

      // optional bool weak = 10 [default = false];
      case 10: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_weak:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &weak_)));
          set_has_weak();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}